

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenGEXImporter.cpp
# Opt level: O1

void __thiscall
Assimp::OpenGEX::OpenGEXImporter::handleNameNode
          (OpenGEXImporter *this,DDLNode *node,aiScene *param_2)

{
  aiNode *paVar1;
  pointer ppaVar2;
  pointer ppaVar3;
  _Alloc_hider __src;
  ai_uint32 aVar4;
  Value *this_00;
  char *__s;
  size_t sVar5;
  mapped_type_conflict3 *pmVar6;
  runtime_error *prVar7;
  string name;
  aiString aiName;
  key_type local_448;
  aiString local_428;
  
  if (this->m_currentNode == (aiNode *)0x0) {
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_428._0_8_ = local_428.data + 0xc;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_428,"No current node for name.","");
    std::runtime_error::runtime_error(prVar7,(string *)&local_428);
    *(undefined ***)prVar7 = &PTR__runtime_error_007fa260;
    __cxa_throw(prVar7,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  this_00 = ODDLParser::DDLNode::getValue(node);
  if (this_00 != (Value *)0x0) {
    if (this_00->m_type != ddl_string) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_428._0_8_ = local_428.data + 0xc;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_428,"OpenGEX: invalid data type for value in node name.","");
      std::runtime_error::runtime_error(prVar7,(string *)&local_428);
      *(undefined ***)prVar7 = &PTR__runtime_error_007fa260;
      __cxa_throw(prVar7,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    __s = ODDLParser::Value::getString(this_00);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_448,__s,(allocator<char> *)&local_428);
    __src._M_p = local_448._M_dataplus._M_p;
    if (this->m_tokenType - 5U < 3) {
      sVar5 = strlen(local_448._M_dataplus._M_p);
      aVar4 = (ai_uint32)sVar5;
      if ((int)aVar4 < 0x400) {
        paVar1 = this->m_currentNode;
        (paVar1->mName).length = aVar4;
        memcpy((paVar1->mName).data,__src._M_p,(long)(int)aVar4);
        (paVar1->mName).data[(int)aVar4] = '\0';
      }
    }
    else if (this->m_tokenType == 0xf) {
      local_428._0_8_ = local_428._0_8_ & 0xffffff0000000000;
      memset((void *)((long)&local_428 + 5),0x1b,0x3ff);
      if (local_448._M_string_length < 0x400) {
        local_428.length = (int)local_448._M_string_length;
        memcpy((void *)((long)&local_428 + 4),local_448._M_dataplus._M_p,local_448._M_string_length)
        ;
        *(undefined1 *)((long)&local_428 + local_448._M_string_length + 4) = 0;
      }
      aiMaterial::AddProperty(this->m_currentMaterial,&local_428,"?mat.name",0,0);
      ppaVar2 = (this->m_materialCache).
                super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      ppaVar3 = (this->m_materialCache).
                super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      pmVar6 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
               ::operator[](&this->m_material2refMap,&local_448);
      *pmVar6 = ((long)ppaVar3 - (long)ppaVar2 >> 3) - 1;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_448._M_dataplus._M_p != &local_448.field_2) {
      operator_delete(local_448._M_dataplus._M_p,local_448.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void OpenGEXImporter::handleNameNode( DDLNode *node, aiScene * /*pScene*/ ) {
    if( nullptr == m_currentNode ) {
        throw DeadlyImportError( "No current node for name." );
        return;
    }

    Value *val( node->getValue() );
    if( nullptr != val ) {
        if( Value::ddl_string != val->m_type ) {
            throw DeadlyImportError( "OpenGEX: invalid data type for value in node name." );
            return;
        }

        const std::string name( val->getString() );
        if( m_tokenType == Grammar::GeometryNodeToken || m_tokenType == Grammar::LightNodeToken
                || m_tokenType == Grammar::CameraNodeToken ) {
            m_currentNode->mName.Set( name.c_str() );
        } else if( m_tokenType == Grammar::MaterialToken ) {
            aiString aiName;
            aiName.Set( name );
            m_currentMaterial->AddProperty( &aiName, AI_MATKEY_NAME );
            m_material2refMap[ name ] = m_materialCache.size() - 1;
        }
    }
}